

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O3

bool __thiscall IceCore::Container::Resize(Container *this,udword needed)

{
  uint uVar1;
  udword uVar2;
  udword *__src;
  udword *__dest;
  uint uVar3;
  udword uVar4;
  
  uVar1 = this->mMaxNbEntries;
  uVar4 = mUsedRam + uVar1 * -4;
  uVar3 = 2;
  if (uVar1 != 0) {
    uVar3 = (uint)(long)((float)uVar1 * this->mGrowthFactor);
  }
  uVar2 = this->mCurNbEntries;
  uVar1 = needed + uVar2;
  if (needed + uVar2 < uVar3) {
    uVar1 = uVar3;
  }
  mUsedRam = uVar4;
  this->mMaxNbEntries = uVar1;
  __dest = (udword *)operator_new__((ulong)uVar1 * 4);
  mUsedRam = uVar4 + uVar1 * 4;
  __src = this->mEntries;
  if (uVar2 != 0) {
    memcpy(__dest,__src,(ulong)(uVar2 << 2));
  }
  if (__src != (udword *)0x0) {
    operator_delete__(__src);
  }
  this->mEntries = __dest;
  return true;
}

Assistant:

bool Container::Resize(udword needed)
{
#ifdef CONTAINER_STATS
	// Subtract previous amount of bytes
	mUsedRam-=mMaxNbEntries*sizeof(udword);
#endif

	// Get more entries
	mMaxNbEntries = mMaxNbEntries ? udword(float(mMaxNbEntries)*mGrowthFactor) : 2;	// Default nb Entries = 2
	if(mMaxNbEntries<mCurNbEntries + needed)	mMaxNbEntries = mCurNbEntries + needed;

	// Get some bytes for new entries
	udword*	NewEntries = new udword[mMaxNbEntries];
	CHECKALLOC(NewEntries);

#ifdef CONTAINER_STATS
	// Add current amount of bytes
	mUsedRam+=mMaxNbEntries*sizeof(udword);
#endif

	// Copy old data if needed
	if(mCurNbEntries)	CopyMemory(NewEntries, mEntries, mCurNbEntries*sizeof(udword));

	// Delete old data
	DELETEARRAY(mEntries);

	// Assign new pointer
	mEntries = NewEntries;

	return true;
}